

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O3

int zddGroupSiftingBackward(DdManager *table,Move *moves,int size)

{
  Move **ppMVar1;
  DdSubtable *pDVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Move *pMVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  
  pMVar11 = moves;
  if (moves == (Move *)0x0) {
    return 1;
  }
  do {
    if (pMVar11->size < size) {
      size = pMVar11->size;
    }
    ppMVar1 = &pMVar11->next;
    pMVar11 = *ppMVar1;
  } while (*ppMVar1 != (Move *)0x0);
  while( true ) {
    if (moves == (Move *)0x0) {
      return 1;
    }
    if (moves->size == size) break;
    pDVar2 = table->subtableZ;
    uVar7 = moves->x;
    uVar12 = (ulong)uVar7;
    uVar9 = moves->y;
    if ((pDVar2[uVar12].next == uVar7) && (pDVar2[uVar9].next == uVar9)) {
      iVar3 = cuddZddSwapInPlace(table,uVar7,uVar9);
      if (iVar3 == 0) {
        return 0;
      }
    }
    else {
      uVar10 = pDVar2[(int)uVar7].next;
      uVar8 = uVar9;
      do {
        uVar15 = uVar8;
        uVar8 = pDVar2[(int)uVar15].next;
      } while (uVar15 < pDVar2[(int)uVar15].next);
      iVar13 = uVar7 - uVar10;
      iVar3 = uVar15 - uVar9;
      uVar8 = uVar10;
      if (-1 < iVar3) {
        uVar5 = uVar9;
        iVar14 = 1;
        do {
          iVar16 = (uVar7 - uVar10) + 1;
          if (-1 < iVar13) {
            do {
              uVar6 = (uint)uVar12;
              iVar4 = cuddZddSwapInPlace(table,uVar6,uVar5);
              if (iVar4 == 0) {
                return 0;
              }
              uVar5 = cuddZddNextLow(table,uVar6);
              uVar12 = (ulong)uVar5;
              iVar16 = iVar16 + -1;
              uVar5 = uVar6;
            } while (iVar16 != 0);
          }
          uVar5 = iVar14 + uVar9;
          uVar6 = cuddZddNextLow(table,uVar5);
          uVar12 = (ulong)uVar6;
          bVar17 = iVar14 != iVar3 + 1;
          iVar14 = iVar14 + 1;
        } while (bVar17);
        if (uVar15 != uVar9) {
          do {
            uVar7 = cuddZddNextHigh(table,uVar8);
            table->subtableZ[(int)uVar8].next = uVar7;
            uVar8 = cuddZddNextHigh(table,uVar8);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
      }
      table->subtableZ[(int)uVar8].next = uVar10;
      uVar9 = cuddZddNextHigh(table,uVar8);
      uVar7 = uVar9;
      if (0 < iVar13) {
        do {
          uVar10 = cuddZddNextHigh(table,uVar7);
          table->subtableZ[(int)uVar7].next = uVar10;
          uVar7 = cuddZddNextHigh(table,uVar7);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      table->subtableZ[(int)uVar7].next = uVar9;
    }
    moves = moves->next;
  }
  return 1;
}

Assistant:

static int
zddGroupSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size)
{
    Move *move;
    int  res;


    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        if ((table->subtableZ[move->x].next == move->x) &&
        (table->subtableZ[move->y].next == move->y)) {
            res = cuddZddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"zddGroupSiftingBackward:\n");
            assert(table->subtableZ[move->x].next == move->x);
            assert(table->subtableZ[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            res = zddGroupMoveBackward(table,(int)move->x,(int)move->y);
            if (!res) return(0);
        }
    }

    return(1);

}